

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::compileBootstrapValue
          (NodeTranslator *this,Reader source,Reader type,Builder target,
          Maybe<capnp::Schema> *typeScope)

{
  Reader RVar1;
  Reader RVar2;
  Builder BVar3;
  Which WVar4;
  Schema *pSVar5;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  Schema local_198;
  Schema local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  UnfinishedValue local_118;
  SegmentBuilder *local_78;
  CapTableBuilder *pCStack_70;
  void *local_68;
  WirePointer *pWStack_60;
  StructDataBitCount local_58;
  StructPointerCount SStack_54;
  undefined2 uStack_52;
  SegmentReader *local_48;
  CapTableReader *pCStack_40;
  void *local_38;
  WirePointer *pWStack_30;
  StructDataBitCount local_28;
  StructPointerCount SStack_24;
  undefined2 uStack_22;
  int iStack_20;
  undefined4 uStack_1c;
  Maybe<capnp::Schema> *local_18;
  Maybe<capnp::Schema> *typeScope_local;
  NodeTranslator *this_local;
  
  BVar3._builder = target._builder;
  RVar2._reader = type._reader;
  local_28 = type._reader.dataSize;
  SStack_24 = type._reader.pointerCount;
  uStack_22 = type._reader._38_2_;
  iStack_20 = type._reader.nestingLimit;
  uStack_1c = type._reader._44_4_;
  local_38 = type._reader.data;
  pWStack_30 = type._reader.pointers;
  local_48 = type._reader.segment;
  pCStack_40 = type._reader.capTable;
  local_58 = target._builder.dataSize;
  SStack_54 = target._builder.pointerCount;
  uStack_52 = target._builder._38_2_;
  local_68 = target._builder.data;
  pWStack_60 = target._builder.pointers;
  local_78 = target._builder.segment;
  pCStack_70 = target._builder.capTable;
  local_18 = typeScope;
  typeScope_local = (Maybe<capnp::Schema> *)this;
  compileDefaultDefaultValue(this,RVar2,BVar3);
  WVar4 = capnp::schema::Type::Reader::which(&type);
  RVar1 = source;
  if ((WVar4 == LIST) || (WVar4 - 0x10 < 3)) {
    local_118.source._reader.segment = source._reader.segment;
    local_118.source._reader.capTable = source._reader.capTable;
    local_118.source._reader.data = source._reader.data;
    local_118.source._reader.pointers = source._reader.pointers;
    local_118.source._reader.dataSize = source._reader.dataSize;
    local_118.source._reader.pointerCount = source._reader.pointerCount;
    local_118.source._reader._38_2_ = source._reader._38_2_;
    source._reader._40_8_ = RVar1._reader._40_8_;
    local_118.source._reader.nestingLimit = source._reader.nestingLimit;
    local_118.source._reader._44_4_ = source._reader._44_4_;
    local_118.type._reader.segment = type._reader.segment;
    local_118.type._reader.capTable = type._reader.capTable;
    local_118.type._reader.data = type._reader.data;
    local_118.type._reader.pointers = type._reader.pointers;
    local_118.type._reader.dataSize = type._reader.dataSize;
    local_118.type._reader.pointerCount = type._reader.pointerCount;
    local_118.type._reader._38_2_ = type._reader._38_2_;
    local_118.type._reader.nestingLimit = type._reader.nestingLimit;
    local_118.type._reader._44_4_ = type._reader._44_4_;
    source = RVar1;
    kj::Maybe<capnp::Schema>::Maybe(&local_118.typeScope,typeScope);
    local_118.target._builder.dataSize = target._builder.dataSize;
    local_118.target._builder.pointerCount = target._builder.pointerCount;
    local_118.target._builder._38_2_ = target._builder._38_2_;
    local_118.target._builder.segment = target._builder.segment;
    local_118.target._builder.capTable = target._builder.capTable;
    local_118.target._builder.data = target._builder.data;
    local_118.target._builder.pointers = target._builder.pointers;
    kj::Vector<capnp::compiler::NodeTranslator::UnfinishedValue>::
    add<capnp::compiler::NodeTranslator::UnfinishedValue>(&this->unfinishedValues,&local_118);
    UnfinishedValue::~UnfinishedValue(&local_118);
  }
  else {
    memcpy(&local_158,&source,0x30);
    memcpy(&local_188,&type,0x30);
    Schema::Schema(&local_198);
    pSVar5 = kj::Maybe<capnp::Schema>::orDefault(typeScope,&local_198);
    local_190.raw = pSVar5->raw;
    memcpy(&local_1c0,&target,0x28);
    RVar1._reader.capTable = (CapTableReader *)uStack_150;
    RVar1._reader.segment = (SegmentReader *)local_158;
    RVar1._reader.data = (void *)local_148;
    RVar1._reader.pointers = (WirePointer *)uStack_140;
    RVar1._reader.dataSize = (undefined4)local_138;
    RVar1._reader.pointerCount = local_138._4_2_;
    RVar1._reader._38_2_ = local_138._6_2_;
    RVar1._reader._40_8_ = uStack_130;
    RVar2._reader.capTable = (CapTableReader *)uStack_180;
    RVar2._reader.segment = (SegmentReader *)local_188;
    RVar2._reader.data = (void *)local_178;
    RVar2._reader.pointers = (WirePointer *)uStack_170;
    RVar2._reader.dataSize = (undefined4)local_168;
    RVar2._reader.pointerCount = local_168._4_2_;
    RVar2._reader._38_2_ = local_168._6_2_;
    RVar2._reader._40_8_ = uStack_160;
    BVar3._builder.capTable = (CapTableBuilder *)uStack_1b8;
    BVar3._builder.segment = (SegmentBuilder *)local_1c0;
    BVar3._builder.data = (void *)local_1b0;
    BVar3._builder.pointers = (WirePointer *)uStack_1a8;
    BVar3._builder.dataSize = (undefined4)local_1a0;
    BVar3._builder.pointerCount = local_1a0._4_2_;
    BVar3._builder._38_2_ = local_1a0._6_2_;
    compileValue(this,RVar1,RVar2,local_190,BVar3,true);
  }
  return;
}

Assistant:

void NodeTranslator::compileBootstrapValue(
    Expression::Reader source, schema::Type::Reader type, schema::Value::Builder target,
    kj::Maybe<Schema> typeScope) {
  // Start by filling in a default default value so that if for whatever reason we don't end up
  // initializing the value, this won't cause schema validation to fail.
  compileDefaultDefaultValue(type, target);

  switch (type.which()) {
    case schema::Type::LIST:
    case schema::Type::STRUCT:
    case schema::Type::INTERFACE:
    case schema::Type::ANY_POINTER:
      unfinishedValues.add(UnfinishedValue { source, type, typeScope, target });
      break;

    default:
      // Primitive value. (Note that the scope can't possibly matter since primitives are not
      // generic.)
      compileValue(source, type, typeScope.orDefault(Schema()), target, true);
      break;
  }
}